

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_pointcloud.cpp
# Opt level: O0

bool __thiscall ON_PointCloud::SwapCoordinates(ON_PointCloud *this,int i,int j)

{
  bool bVar1;
  bool local_19;
  bool rc;
  int j_local;
  int i_local;
  ON_PointCloud *this_local;
  
  local_19 = ON_3dPointArray::SwapCoordinates(&this->m_P,i,j);
  if ((local_19) && (bVar1 = HasPlane(this), bVar1)) {
    local_19 = ON_Plane::SwapCoordinates(&this->m_plane,i,j);
  }
  if ((local_19 != false) && (bVar1 = ON_BoundingBox::IsValid(&this->m_bbox), bVar1)) {
    local_19 = ON_BoundingBox::SwapCoordinates(&this->m_bbox,i,j);
  }
  return local_19;
}

Assistant:

bool ON_PointCloud::SwapCoordinates(
      int i, int j        // indices of coords to swap
      )
{
  bool rc = m_P.SwapCoordinates(i,j);
  if ( rc && HasPlane() ) {
    rc = m_plane.SwapCoordinates(i,j);
  }
  if ( rc && m_bbox.IsValid() ) {
    rc = m_bbox.SwapCoordinates(i,j);
  }
  return rc;
}